

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

Token * __thiscall inja::Lexer::scan_string(Token *__return_storage_ptr__,Lexer *this)

{
  size_t sVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  size_t sVar6;
  
  uVar3 = (this->m_in)._M_len;
  pcVar4 = (this->m_in)._M_str;
  bVar5 = false;
  sVar6 = this->pos;
  while (sVar6 < uVar3) {
    sVar1 = sVar6 + 1;
    this->pos = sVar1;
    cVar2 = pcVar4[sVar6];
    sVar6 = sVar1;
    if (cVar2 == '\\') {
      bVar5 = (bool)(bVar5 ^ 1);
    }
    else {
      if ((!bVar5) && (cVar2 == pcVar4[this->tok_start])) break;
      bVar5 = false;
    }
  }
  make_token(__return_storage_ptr__,this,String);
  return __return_storage_ptr__;
}

Assistant:

Token scan_string() {
    bool escape {false};
    for (;;) {
      if (pos >= m_in.size()) {
        break;
      }
      const char ch = m_in[pos++];
      if (ch == '\\') {
        escape = !escape;
      } else if (!escape && ch == m_in[tok_start]) {
        break;
      } else {
        escape = false;
      }
    }
    return make_token(Token::Kind::String);
  }